

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O3

float SolveBezier(float x,float p0,float p1,float p2,float p3)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar10;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  float fVar11;
  double local_38;
  
  if (p3 < p2) {
    return 0.0;
  }
  if (p2 < p0) {
    return 0.0;
  }
  if (p3 < p1) {
    return 0.0;
  }
  if (p0 <= p1) {
    if (x < p0) {
      return 0.0;
    }
    if (p3 < x) {
      return 0.0;
    }
    fVar11 = p2 * -3.0 + (p1 * 3.0 - p0) + p3;
    fVar6 = p2 * 3.0 + p0 * 3.0 + p1 * -6.0;
    fVar10 = p0 * -3.0 + p1 * 3.0;
    auVar5._0_8_ = (double)fVar6;
    auVar5._8_8_ = (double)fVar10;
    auVar4._0_8_ = (double)(p0 - x);
    if ((((fVar11 != 0.0) || (NAN(fVar11))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
      if ((fVar11 != 0.0) || (NAN(fVar11))) {
        dVar3 = (double)fVar11;
        auVar9._8_8_ = dVar3;
        auVar9._0_8_ = dVar3;
        auVar5 = divpd(auVar5,auVar9);
        dVar2 = auVar5._0_8_;
        local_38 = dVar2 / 3.0;
        dVar7 = (dVar2 * dVar2) / -9.0 + auVar5._8_8_ / 3.0;
        auVar4._8_8_ = (dVar2 + dVar2) * dVar2 * dVar2;
        auVar1._8_4_ = 0;
        auVar1._0_8_ = dVar3;
        auVar1._12_4_ = 0x403b0000;
        auVar4 = divpd(auVar4,auVar1);
        dVar8 = ((auVar4._8_8_ - (auVar5._8_8_ * dVar2) / 3.0) + auVar4._0_8_) * 0.5;
        dVar3 = dVar7 * dVar7 * dVar7;
        dVar2 = dVar8 * dVar8 + dVar3;
        if (dVar2 <= 0.0) {
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if (-0.0 < dVar3) {
              dVar3 = sqrt(-dVar3);
            }
            else {
              dVar3 = SQRT(-dVar3);
            }
            dVar3 = acos(-dVar8 / dVar3);
            dVar3 = dVar3 / 3.0;
            if (-0.0 < dVar7) {
              dVar7 = sqrt(-dVar7);
            }
            else {
              dVar7 = SQRT(-dVar7);
            }
            dVar7 = dVar7 + dVar7;
            dVar2 = cos(dVar3);
            dVar2 = dVar2 * dVar7 - local_38;
            if ((dVar2 < 0.0) || (1.000100016593933 < dVar2)) {
              local_38 = -local_38;
              dVar2 = cos(dVar3 + 1.0471975803375244);
              dVar2 = local_38 - dVar2 * dVar7;
              if ((dVar2 < 0.0) || (1.000100016593933 < dVar2)) {
                dVar3 = cos(dVar3 + -1.0471975803375244);
                dVar2 = dVar3 * -dVar7 + local_38;
              }
            }
          }
          else {
            dVar7 = CubicRoot(-dVar8);
            dVar3 = (dVar7 + dVar7) - local_38;
            dVar2 = (double)(~-(ulong)(0.0 <= dVar3) & (ulong)(-dVar7 - local_38) |
                            (~-(ulong)(dVar3 <= 1.000100016593933) & (ulong)(-dVar7 - local_38) |
                            -(ulong)(dVar3 <= 1.000100016593933) & (ulong)dVar3) &
                            -(ulong)(0.0 <= dVar3));
          }
        }
        else {
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          dVar3 = CubicRoot(dVar2 - dVar8);
          dVar7 = CubicRoot(dVar8 + dVar2);
          dVar2 = (dVar3 - dVar7) - local_38;
        }
        return (float)dVar2;
      }
      dVar3 = auVar4._0_8_ / auVar5._0_8_;
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        return 0.0;
      }
      dVar7 = auVar5._8_8_ / auVar5._0_8_;
      dVar3 = dVar7 * dVar7 + dVar3 * -4.0;
      if (dVar3 < 0.0) {
        dVar2 = sqrt(dVar3);
      }
      else {
        dVar2 = SQRT(dVar3);
      }
      dVar2 = (dVar2 - dVar7) * 0.5;
      if ((dVar2 < 0.0) || (1.000100016593933 < dVar2)) {
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        dVar2 = (-dVar7 - dVar3) * 0.5;
      }
    }
    else {
      if ((fVar10 == 0.0) && (!NAN(fVar10))) {
        return 0.0;
      }
      dVar2 = -auVar4._0_8_ / auVar5._8_8_;
    }
    return (float)dVar2;
  }
  return 0.0;
}

Assistant:

float SolveBezier(float x, float p0, float p1, float p2, float p3)
{
	// check for valid f-curve
	// we only take care of monotonic bezier curves, so there has to be exactly 1 real solution
	if(!(p0 <= x && x <= p3) || !(p0 <= p1 && p1 <= p3) || !(p0 <= p2 && p2 <= p3))
		return 0.0f;

	double a, b, c, t;
	double x3 = -p0 + 3*p1 - 3*p2 + p3;
	double x2 = 3*p0 - 6*p1 + 3*p2;
	double x1 = -3*p0 + 3*p1;
	double x0 = p0 - x;

	if(x3 == 0.0 && x2 == 0.0)
	{
		// linear
		// a*t + b = 0
		a = x1;
		b = x0;

		if(a == 0.0)
			return 0.0f;
		else
			return -b/a;
	}
	else if(x3 == 0.0)
	{
		// quadratic
		// t*t + b*t +c = 0
		b = x1/x2;
		c = x0/x2;

		if(c == 0.0)
			return 0.0f;

		double D = b*b - 4*c;

		t = (-b + sqrt(D))/2;

		if(0.0 <= t && t <= 1.0001f)
			return t;
		else
			return (-b - sqrt(D))/2;
	}
	else
	{
		// cubic
		// t*t*t + a*t*t + b*t*t + c = 0
		a = x2 / x3;
		b = x1 / x3;
		c = x0 / x3;

		// substitute t = y - a/3
		double sub = a/3.0;

		// depressed form x^3 + px + q = 0
		// cardano's method
		double p = b/3 - a*a/9;
		double q = (2*a*a*a/27 - a*b/3 + c)/2;

		double D = q*q + p*p*p;

		if(D > 0.0)
		{
			// only one 'real' solution
			double s = sqrt(D);
			return CubicRoot(s-q) - CubicRoot(s+q) - sub;
		}
		else if(D == 0.0)
		{
			// one single, one double solution or triple solution
			double s = CubicRoot(-q);
			t = 2*s - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;
			else
				return (-s - sub);

		}
		else
		{
			// Casus irreductibilis ... ,_,
			double phi = acos(-q / sqrt(-(p*p*p))) / 3;
			double s = 2*sqrt(-p);

			t = s*cos(phi) - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;

			t = -s*cos(phi+pi/3) - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;
			else
				return -s*cos(phi-pi/3) - sub;
		}
	}
}